

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O2

Iterator * __thiscall
ctemplate::TemplateDictionary::CreateTemplateIterator
          (TemplateDictionary *this,TemplateString *section_name)

{
  small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *c;
  TemplateId v;
  second_type dv;
  Iterator<__gnu_cxx::__normal_iterator<ctemplate::TemplateDictionary_*const_*,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_>_>
  *pIVar1;
  
  do {
    if (this == (TemplateDictionary *)0x0) {
      __assert_fail("\"Call IsHiddenTemplate before CreateTemplateIterator\" && 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                    ,0x3ec,
                    "virtual TemplateDictionaryInterface::Iterator *ctemplate::TemplateDictionary::CreateTemplateIterator(const TemplateString &) const"
                   );
    }
    c = this->include_dict_;
    if (c != (small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
              *)0x0) {
      v = TemplateString::GetGlobalId(section_name);
      dv = find_ptr2<ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,unsigned_long>
                     (c,v);
      if (dv != (second_type)0x0) {
        pIVar1 = MakeIterator<std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>>
                           (dv);
        return &pIVar1->super_Iterator;
      }
    }
    this = this->parent_dict_;
  } while( true );
}

Assistant:

TemplateDictionaryInterface::Iterator*
TemplateDictionary::CreateTemplateIterator(
    const TemplateString& section_name) const {
  for (const TemplateDictionary* d = this; d; d = d->parent_dict_) {
    if (d->include_dict_) {
      if (DictVector* it = find_ptr2(*d->include_dict_, section_name.GetGlobalId())) {
        // Found it!  Return it as an Iterator
        return MakeIterator(*it);
      }
    }
  }
  assert("Call IsHiddenTemplate before CreateTemplateIterator" && 0);
  abort();
}